

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_node *
lys_node_dup(lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow)

{
  int iVar1;
  lys_node *node_00;
  lys_node *plVar2;
  lys_node *plVar3;
  bool bVar4;
  int local_68;
  lys_node *local_60;
  lys_node *next;
  lys_node *iter;
  lys_node *result;
  lys_node *plStack_40;
  int finalize;
  lys_node *p;
  int shallow_local;
  unres_schema *unres_local;
  lys_node *node_local;
  lys_node *parent_local;
  lys_module *module_local;
  
  result._4_4_ = 0;
  plStack_40 = parent;
  if (shallow == 0) {
    while( true ) {
      bVar4 = false;
      if (plStack_40 != (lys_node *)0x0) {
        bVar4 = (plStack_40->nodetype &
                (LYS_ACTION|LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN;
      }
      if (!bVar4) break;
      plStack_40 = lys_parent(plStack_40);
    }
    if (plStack_40 == (lys_node *)0x0) {
      local_68 = 1;
    }
    else {
      local_68 = 2;
      if (plStack_40->nodetype == LYS_GROUPING) {
        local_68 = 0;
      }
    }
    result._4_4_ = local_68;
  }
  node_00 = lys_node_dup_recursion(module,parent,node,unres,shallow,result._4_4_);
  next = node_00;
  if (result._4_4_ != 0) {
    while (next != (lys_node *)0x0) {
      iVar1 = lys_has_xpath(next);
      if ((iVar1 != 0) &&
         (iVar1 = unres_schema_add_node(module,unres,next,UNRES_XPATH,(lys_node *)0x0), iVar1 == -1)
         ) {
        return (lys_node *)0x0;
      }
      if ((next->nodetype & 0x882c) == LYS_UNKNOWN) {
        local_60 = next->child;
      }
      else {
        local_60 = (lys_node *)0x0;
      }
      if (local_60 == (lys_node *)0x0) {
        if (next == node_00) {
          return node_00;
        }
        local_60 = next->next;
      }
      while (local_60 == (lys_node *)0x0) {
        next = lys_parent(next);
        plVar2 = lys_parent(next);
        plVar3 = lys_parent(node_00);
        if (plVar2 == plVar3) break;
        local_60 = next->next;
      }
      next = local_60;
    }
  }
  return node_00;
}

Assistant:

struct lys_node *
lys_node_dup(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
             struct unres_schema *unres, int shallow)
{
    struct lys_node *p = NULL;
    int finalize = 0;
    struct lys_node *result, *iter, *next;

    if (!shallow) {
        /* get know where in schema tree we are to know what should be done during instantiation of the grouping */
        for (p = parent;
             p && !(p->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC | LYS_ACTION | LYS_GROUPING));
             p = lys_parent(p));
        finalize = p ? ((p->nodetype == LYS_GROUPING) ? 0 : 2) : 1;
    }

    result = lys_node_dup_recursion(module, parent, node, unres, shallow, finalize);
    if (finalize) {
        /* check xpath expressions in the instantiated tree */
        for (iter = next = result; iter; iter = next) {
            if (lys_has_xpath(iter) && unres_schema_add_node(module, unres, iter, UNRES_XPATH, NULL) == -1) {
                /* invalid xpath */
                return NULL;
            }

            /* select next item */
            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA | LYS_GROUPING)) {
                /* child exception for leafs, leaflists and anyxml without children, ignore groupings */
                next = NULL;
            } else {
                next = iter->child;
            }
            if (!next) {
                /* no children, try siblings */
                if (iter == result) {
                    /* we are done, no next element to process */
                    break;
                }
                next = iter->next;
            }
            while (!next) {
                /* parent is already processed, go to its sibling */
                iter = lys_parent(iter);
                if (lys_parent(iter) == lys_parent(result)) {
                    /* we are done, no next element to process */
                    break;
                }
                next = iter->next;
            }
        }
    }

    return result;
}